

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

void __thiscall
QTextDocumentLayoutPrivate::layoutFlow
          (QTextDocumentLayoutPrivate *this,Iterator it,QTextLayoutStruct *layoutStruct,
          int layoutFrom,int layoutTo,QFixed width)

{
  QFixedPoint QVar1;
  QFixedPoint QVar2;
  QFixedPoint QVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  Int IVar7;
  Int IVar8;
  int iVar9;
  Position PVar10;
  QFixed QVar11;
  QTextFrameData *pQVar12;
  QTextDocumentLayoutPrivate *this_00;
  QTextDocumentLayoutPrivate *pQVar13;
  iterator iVar14;
  QTextFrame *pQVar15;
  const_reference pQVar16;
  QTextLayout *pQVar17;
  QTextLayoutStruct *this_01;
  QFixed *pQVar18;
  QTextTable *pQVar19;
  qsizetype qVar20;
  QTextFrameData *pQVar21;
  QCheckPoint *pQVar22;
  int in_ECX;
  undefined4 in_EDX;
  QTextLayoutStruct *in_RSI;
  long in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  qreal qVar23;
  QTextLine QVar24;
  QTextFrame *in_stack_00000008;
  undefined1 *in_stack_00000010;
  QTextFrame *in_stack_00000018;
  int in_stack_00000020;
  QTextFrameData *fd_1;
  int i;
  QTextLayout *layout_1;
  QTextTableData *td_1;
  QTextLayout *layout;
  QTextTableData *td;
  QTextBlockFormat *previousBlockFormatPtr;
  int page_1;
  QTextTable *table;
  QTextFrameData *cd;
  int docPos;
  QTextFrame *c;
  int page;
  bool redoCheckPoints;
  bool inRootFrame;
  QTextFrameData *fd;
  QCheckPoint cp_1;
  QList<QTextFrame_*> children;
  QPointF linePos;
  QFixed height;
  QPointF pos_1;
  qreal lastBlockBottomMargin;
  QFixed origMaximumWidth;
  QFixed origPageBottom;
  QFixed origY;
  QRectF frameRect;
  QRectF updateRect;
  QRectF oldFrameRect;
  QFixed absoluteChildPos;
  Alignment align;
  QFixedPoint pos;
  QFixed right_1;
  QFixed left_1;
  QCheckPoint p;
  QFixed right;
  QFixed left;
  QFixed maximumBlockWidth;
  QCheckPoint cp;
  iterator checkPoint;
  QTextBlock lastBlock;
  QTextBlockFormat blockFormat;
  QTextBlock block;
  Iterator lastIt;
  QTextFrameFormat fformat;
  QTextBlockFormat previousBlockFormat;
  Iterator previousIt;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QFixed in_stack_fffffffffffff828;
  QFixed in_stack_fffffffffffff82c;
  QTextLayoutStruct *in_stack_fffffffffffff830;
  QTextLayoutStruct *in_stack_fffffffffffff838;
  QRectF *in_stack_fffffffffffff840;
  undefined6 in_stack_fffffffffffff848;
  undefined1 in_stack_fffffffffffff84e;
  undefined1 in_stack_fffffffffffff84f;
  byte bVar25;
  QList<QCheckPoint> *in_stack_fffffffffffff858;
  iterator in_stack_fffffffffffff860;
  iterator in_stack_fffffffffffff868;
  QTextLayoutStruct *in_stack_fffffffffffff870;
  QTextDocumentLayoutPrivate *in_stack_fffffffffffff878;
  QTextDocumentLayoutPrivate *in_stack_fffffffffffff880;
  undefined7 in_stack_fffffffffffff888;
  undefined1 in_stack_fffffffffffff88f;
  QTextDocumentLayoutPrivate *in_stack_fffffffffffff890;
  undefined4 in_stack_fffffffffffff898;
  QFixed in_stack_fffffffffffff89c;
  QFixed in_stack_fffffffffffff8b4;
  QTextDocumentLayoutPrivate *in_stack_fffffffffffff8b8;
  int in_stack_fffffffffffff8e8;
  uint in_stack_fffffffffffff8ec;
  bool local_701;
  long in_stack_fffffffffffff900;
  undefined7 in_stack_fffffffffffff908;
  undefined1 in_stack_fffffffffffff90f;
  int local_6c4;
  QTextFrameData *in_stack_fffffffffffff948;
  QTextLayoutStruct *local_698;
  QFixed in_stack_fffffffffffff994;
  QTextLayoutStruct *in_stack_fffffffffffff998;
  QFixed in_stack_fffffffffffff9a0;
  int blockPosition;
  undefined4 in_stack_fffffffffffff9b0;
  QFixed in_stack_fffffffffffff9b4;
  iterator in_stack_fffffffffffff9b8;
  bool local_60a;
  QFixed local_5cc;
  int local_5c8;
  int local_5c4;
  QList<QTextFrame_*> local_5c0;
  QFixed local_5a8;
  QFixed local_5a4;
  QFixed local_5a0;
  QFixed local_59c;
  QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4> local_598;
  QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4> local_594;
  QPointF local_590;
  QPointF local_580;
  int local_570;
  QTextEngine *local_568;
  int local_560;
  int local_55c;
  int local_558;
  QFixed local_554;
  int local_550;
  QFixed local_54c;
  QPointF local_548;
  int local_538;
  int local_534;
  QPointF local_530;
  QPointF local_520;
  QPointF local_510;
  int local_4fc;
  int local_4f8;
  int local_4f4;
  int local_4f0;
  QTextEngine *local_4e8;
  QFixed local_4dc;
  QRectF local_4d8;
  int local_4b8;
  QFixed local_4b4;
  int local_4b0;
  QFixed local_4ac;
  QPointF local_4a8;
  qreal local_498;
  int local_48c;
  QTextDocumentLayoutPrivate *local_488;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_480;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_47c;
  QFixed local_478;
  int local_474;
  QFixed local_470;
  int local_46c;
  QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4> local_468;
  QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4> local_464;
  QPointF local_460;
  QSizeF local_450;
  QPointF local_440;
  qreal local_430;
  qreal local_428;
  undefined8 local_420;
  undefined8 local_418;
  QFixed local_40c;
  qreal local_408;
  qreal local_400;
  QFixed local_3e4;
  qreal local_3e0;
  qreal local_3d8;
  qreal in_stack_fffffffffffffc40;
  qreal in_stack_fffffffffffffc48;
  qreal qVar26;
  QRectF local_380;
  QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4> local_360;
  QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4> local_35c;
  int local_358;
  int local_354;
  int local_350;
  int local_34c;
  int local_348;
  int local_344;
  int local_340;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_33c;
  int local_338;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_334;
  int local_330;
  int local_32c;
  int local_304;
  int local_2e0;
  QFixed local_2dc;
  int local_2d8;
  QFixed local_2d4;
  QFixed local_2d0;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  int local_2c0;
  QFixed local_2bc [10];
  int local_294;
  int local_26c;
  QFixed local_268;
  int local_264;
  QFixed local_260;
  QFixed local_25c;
  QSizeF local_258;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_244;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_240;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_23c;
  Int local_238;
  int local_234;
  QFixed in_stack_fffffffffffffdd0;
  QFixed local_22c;
  QFixed in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  QFixed local_208;
  QFixed local_204;
  QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4> local_200;
  QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4> local_1fc;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  QFixed local_1cc;
  QFixed local_1c8;
  QFixed local_1c4;
  int local_1c0;
  int local_1bc;
  QFixed local_1b8;
  QFixed local_1b4;
  undefined8 local_1b0;
  undefined1 *local_1a8;
  undefined8 local_1a0;
  int local_198;
  int local_194;
  int local_190;
  int local_18c;
  QFixed local_188;
  QFixed local_184;
  iterator local_180 [5];
  QDebug local_158;
  undefined4 local_150;
  int local_14c;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 local_d8 [16];
  QTextFrame *local_c8;
  undefined1 *local_c0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 local_68 [16];
  QTextFrame *local_58;
  undefined1 *local_50;
  QTextFrame *local_48;
  int local_40;
  undefined1 local_38 [16];
  QTextFrame *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  qreal local_8;
  
  local_8 = *(qreal *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  local_150 = in_EDX;
  local_14c = in_R8D;
  QtPrivateLogging::lcLayout();
  anon_unknown.dwarf_13b8fb2::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffff830,
             (QLoggingCategory *)
             CONCAT44(in_stack_fffffffffffff82c.val,in_stack_fffffffffffff828.val));
  while (bVar4 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar4) {
    anon_unknown.dwarf_13b8fb2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x802bd8);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838,
               (int)((ulong)in_stack_fffffffffffff830 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff82c.val,in_stack_fffffffffffff828.val),
               (char *)0x802bf1);
    QMessageLogger::debug();
    QDebug::operator<<((QDebug *)
                       CONCAT17(in_stack_fffffffffffff84f,
                                CONCAT16(in_stack_fffffffffffff84e,in_stack_fffffffffffff848)),
                       (char *)in_stack_fffffffffffff878);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffff830,in_stack_fffffffffffff82c.val);
    QDebug::operator<<((QDebug *)
                       CONCAT17(in_stack_fffffffffffff84f,
                                CONCAT16(in_stack_fffffffffffff84e,in_stack_fffffffffffff848)),
                       (char *)in_stack_fffffffffffff878);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffff830,in_stack_fffffffffffff82c.val);
    QDebug::~QDebug(&local_158);
    local_10 = 0;
  }
  pQVar12 = ::data((QTextFrame *)in_stack_fffffffffffff830);
  pQVar12->currentLayoutStruct = in_RSI;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = (QTextFrame *)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QTextFrame::iterator::iterator((iterator *)local_38);
  this_00 = (QTextDocumentLayoutPrivate *)
            QTextFrame::iterator::parentFrame((iterator *)&stack0x00000008);
  pQVar13 = (QTextDocumentLayoutPrivate *)
            QTextDocument::rootFrame((QTextDocument *)in_stack_fffffffffffff830);
  bVar4 = this_00 == pQVar13;
  if (bVar4) {
    local_60a = true;
    if ((in_RSI->fullLayout & 1U) == 0) {
      local_60a = QList<QCheckPoint>::isEmpty((QList<QCheckPoint> *)0x802d55);
    }
    in_stack_fffffffffffff90f = local_60a;
    if (local_60a == false) {
      local_180[0].i = (QCheckPoint *)&DAT_aaaaaaaaaaaaaaaa;
      QList<QCheckPoint>::begin((QList<QCheckPoint> *)in_stack_fffffffffffff830);
      QList<QCheckPoint>::end((QList<QCheckPoint> *)in_stack_fffffffffffff830);
      local_180[0] = std::lower_bound<QList<QCheckPoint>::iterator,int>
                               (in_stack_fffffffffffff868,in_stack_fffffffffffff860,
                                (int *)in_stack_fffffffffffff840);
      iVar14 = QList<QCheckPoint>::end((QList<QCheckPoint> *)in_stack_fffffffffffff830);
      bVar5 = QList<QCheckPoint>::iterator::operator!=(local_180,iVar14);
      if (bVar5) {
        iVar14 = QList<QCheckPoint>::begin((QList<QCheckPoint> *)in_stack_fffffffffffff830);
        bVar5 = QList<QCheckPoint>::iterator::operator!=(local_180,iVar14);
        if (bVar5) {
          QList<QCheckPoint>::iterator::operator--(local_180);
        }
        pQVar22 = QList<QCheckPoint>::iterator::operator->(local_180);
        (in_RSI->y).val = (pQVar22->y).val;
        pQVar22 = QList<QCheckPoint>::iterator::operator->(local_180);
        (in_RSI->frameY).val = (pQVar22->frameY).val;
        pQVar22 = QList<QCheckPoint>::iterator::operator->(local_180);
        (in_RSI->minimumWidth).val = (pQVar22->minimumWidth).val;
        pQVar22 = QList<QCheckPoint>::iterator::operator->(local_180);
        (in_RSI->maximumWidth).val = (pQVar22->maximumWidth).val;
        pQVar22 = QList<QCheckPoint>::iterator::operator->(local_180);
        (in_RSI->contentsWidth).val = (pQVar22->contentsWidth).val;
        local_184.val = (in_RSI->pageHeight).val;
        QFixed::QFixed(&local_188,0);
        bVar5 = operator>(local_184,local_188);
        if (bVar5) {
          QTextLayoutStruct::currentPage(in_stack_fffffffffffff830);
          local_194 = (in_RSI->pageHeight).val;
          local_190 = (int)::operator*(0,in_stack_fffffffffffff82c);
          local_198 = (in_RSI->pageBottomMargin).val;
          local_18c = (int)QFixed::operator-((QFixed *)
                                             CONCAT44(in_stack_fffffffffffff82c.val,
                                                      in_stack_fffffffffffff828.val),
                                             (QFixed)(int)in_stack_fffffffffffff830);
          (in_RSI->pageBottom).val = local_18c;
        }
        QList<QCheckPoint>::iterator::operator->(local_180);
        frameIteratorForTextPosition
                  (in_stack_fffffffffffff880,(int)((ulong)in_stack_fffffffffffff878 >> 0x20));
        in_stack_00000008 = local_58;
        in_stack_00000010 = local_50;
        in_stack_00000018 = local_48;
        in_stack_00000020 = local_40;
        in_stack_fffffffffffff900 = in_RDI + 0x120;
        iVar14 = QList<QCheckPoint>::begin((QList<QCheckPoint> *)in_stack_fffffffffffff830);
        QList<QCheckPoint>::iterator::operator-(local_180,iVar14);
        QList<QCheckPoint>::resize
                  ((QList<QCheckPoint> *)in_stack_fffffffffffff840,
                   (qsizetype)in_stack_fffffffffffff838);
        in_stack_fffffffffffff9b8 =
             QList<QCheckPoint>::begin((QList<QCheckPoint> *)in_stack_fffffffffffff830);
        bVar5 = QList<QCheckPoint>::iterator::operator!=(local_180,in_stack_fffffffffffff9b8);
        if (bVar5) {
          local_38._0_8_ = in_stack_00000008;
          local_38._8_8_ = in_stack_00000010;
          local_28 = in_stack_00000018;
          local_20 = (undefined1 *)CONCAT44(local_20._4_4_,in_stack_00000020);
          QTextFrame::iterator::operator--((iterator *)in_stack_fffffffffffff860.i);
        }
      }
      else {
        local_60a = true;
      }
    }
    if (local_60a != false) {
      QList<QCheckPoint>::clear((QList<QCheckPoint> *)in_stack_fffffffffffff830);
      local_1b0 = &DAT_aaaaaaaaaaaaaaaa;
      local_1a8 = &DAT_aaaaaaaaaaaaaaaa;
      local_1a0 = &DAT_aaaaaaaaaaaaaaaa;
      QCheckPoint::QCheckPoint((QCheckPoint *)in_stack_fffffffffffff830);
      local_1b0 = (undefined1 *)CONCAT44((in_RSI->frameY).val,(in_RSI->y).val);
      local_1a8 = (undefined1 *)((ulong)(uint)(in_RSI->minimumWidth).val << 0x20);
      local_1a0 = (undefined1 *)CONCAT44((in_RSI->contentsWidth).val,(in_RSI->maximumWidth).val);
      QList<QCheckPoint>::append
                ((QList<QCheckPoint> *)in_stack_fffffffffffff830,
                 (parameter_type)
                 CONCAT44(in_stack_fffffffffffff82c.val,in_stack_fffffffffffff828.val));
    }
  }
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextFrame::iterator::currentBlock((iterator *)in_stack_fffffffffffff838);
  QTextBlock::blockFormat((QTextBlock *)in_stack_fffffffffffff840);
  local_1b4.val = -0x55555556;
  QFixed::QFixed(&local_1b4,0);
  while( true ) {
    bVar5 = QTextFrame::iterator::atEnd((iterator *)&stack0x00000008);
    local_701 = false;
    if (!bVar5) {
      in_stack_fffffffffffff9b4 = QTextLayoutStruct::absoluteY(in_stack_fffffffffffff830);
      QFixed::QFixed(&local_1b8,0x7fffff);
      local_701 = ::operator<(in_stack_fffffffffffff9b4,local_1b8);
    }
    if (local_701 == false) break;
    pQVar13 = (QTextDocumentLayoutPrivate *)
              QTextFrame::iterator::currentFrame((iterator *)&stack0x00000008);
    pQVar15 = QTextFrame::iterator::currentFrame((iterator *)&stack0x00000008);
    if (pQVar15 == (QTextFrame *)0x0) {
      QTextFrame::iterator::currentBlock((iterator *)in_stack_fffffffffffff838);
      iVar6 = QTextBlock::position
                        ((QTextBlock *)
                         CONCAT44(in_stack_fffffffffffff82c.val,in_stack_fffffffffffff828.val));
    }
    else {
      QTextFrame::iterator::currentFrame((iterator *)&stack0x00000008);
      iVar6 = QTextFrame::firstPosition
                        ((QTextFrame *)
                         CONCAT44(in_stack_fffffffffffff82c.val,in_stack_fffffffffffff828.val));
    }
    if (bVar4) {
      pQVar22 = QList<QCheckPoint>::constLast
                          ((QList<QCheckPoint> *)
                           CONCAT44(in_stack_fffffffffffff82c.val,in_stack_fffffffffffff828.val));
      local_1c0 = (pQVar22->y).val;
      local_1bc = (int)QFixed::operator-((QFixed *)
                                         CONCAT44(in_stack_fffffffffffff82c.val,
                                                  in_stack_fffffffffffff828.val),
                                         (QFixed)(int)in_stack_fffffffffffff830);
      in_stack_fffffffffffff9a0 =
           qAbs<QFixed>((QFixed *)
                        CONCAT44(in_stack_fffffffffffff82c.val,in_stack_fffffffffffff828.val));
      QFixed::QFixed(&local_1c4,2000);
      bVar5 = operator>(in_stack_fffffffffffff9a0,local_1c4);
      if (bVar5) {
        local_1c8.val = -0x55555556;
        QFixed::QFixed(&local_1c8);
        local_1cc.val = -0x55555556;
        QFixed::QFixed(&local_1cc);
        local_1d0 = (in_RSI->y).val;
        floatMargins(in_stack_fffffffffffff878,in_stack_fffffffffffff89c,in_stack_fffffffffffff870,
                     &(in_stack_fffffffffffff868.i)->y,&(in_stack_fffffffffffff860.i)->y);
        local_1d4 = local_1c8.val;
        local_1d8 = (in_RSI->x_left).val;
        bVar5 = ::operator==(local_1c8,(QFixed)local_1d8);
        if (bVar5) {
          local_1dc = local_1cc.val;
          local_1e0 = (in_RSI->x_right).val;
          bVar5 = ::operator==(local_1cc,(QFixed)local_1e0);
          if (bVar5) {
            local_1f8 = &DAT_aaaaaaaaaaaaaaaa;
            local_1f0 = &DAT_aaaaaaaaaaaaaaaa;
            local_1e8 = &DAT_aaaaaaaaaaaaaaaa;
            QCheckPoint::QCheckPoint((QCheckPoint *)in_stack_fffffffffffff830);
            local_1f8 = (undefined1 *)CONCAT44((in_RSI->frameY).val,(in_RSI->y).val);
            local_1f0 = (undefined1 *)CONCAT44((in_RSI->minimumWidth).val,iVar6);
            local_1e8 = (undefined1 *)
                        CONCAT44((in_RSI->contentsWidth).val,(in_RSI->maximumWidth).val);
            QList<QCheckPoint>::append
                      ((QList<QCheckPoint> *)in_stack_fffffffffffff830,
                       (parameter_type)
                       CONCAT44(in_stack_fffffffffffff82c.val,in_stack_fffffffffffff828.val));
            if ((*(int *)(in_RDI + 0xf8) != -1) &&
               (*(int *)(in_RDI + 0xf8) + *(int *)(in_RDI + 0xfc) < iVar6)) break;
          }
        }
      }
    }
    if (pQVar13 == (QTextDocumentLayoutPrivate *)0x0) {
      local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8 = (QTextFrame *)&DAT_aaaaaaaaaaaaaaaa;
      local_c0 = &DAT_aaaaaaaaaaaaaaaa;
      QTextFrame::iterator::iterator((iterator *)local_d8);
      blockPosition = (int)((ulong)pQVar13 >> 0x20);
      bVar5 = QTextFrame::iterator::atEnd((iterator *)local_38);
      if ((!bVar5) &&
         (bVar5 = QTextFrame::iterator::operator!=
                            ((iterator *)local_38,(iterator *)&stack0x00000008), bVar5)) {
        local_d8._0_8_ = local_38._0_8_;
        local_d8._8_8_ = local_38._8_8_;
        local_c8 = local_28;
        local_c0 = (undefined1 *)CONCAT44(local_c0._4_4_,local_20._0_4_);
      }
      local_38._0_8_ = in_stack_00000008;
      local_38._8_8_ = in_stack_00000010;
      local_28 = in_stack_00000018;
      local_20 = (undefined1 *)CONCAT44(local_20._4_4_,in_stack_00000020);
      local_e8 = &DAT_aaaaaaaaaaaaaaaa;
      local_e0 = &DAT_aaaaaaaaaaaaaaaa;
      QTextFrame::iterator::currentBlock((iterator *)in_stack_fffffffffffff838);
      QTextFrame::iterator::operator++((iterator *)in_stack_fffffffffffff868.i);
      local_f8 = &DAT_aaaaaaaaaaaaaaaa;
      local_f0 = &DAT_aaaaaaaaaaaaaaaa;
      QTextBlock::blockFormat((QTextBlock *)in_stack_fffffffffffff840);
      local_468.super_QFlagsStorage<QTextFormat::PageBreakFlag>.i =
           (QFlagsStorage<QTextFormat::PageBreakFlag>)
           QTextBlockFormat::pageBreakPolicy((QTextBlockFormat *)in_stack_fffffffffffff830);
      local_464.super_QFlagsStorage<QTextFormat::PageBreakFlag>.i =
           (QFlagsStorage<QTextFormat::PageBreakFlag>)
           QFlags<QTextFormat::PageBreakFlag>::operator&
                     ((QFlags<QTextFormat::PageBreakFlag> *)in_stack_fffffffffffff830,
                      in_stack_fffffffffffff82c.val);
      IVar7 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_464);
      if (IVar7 != 0) {
        QTextLayoutStruct::newPage(in_stack_fffffffffffff838);
      }
      local_46c = (in_RSI->y).val;
      local_470.val = (in_RSI->pageBottom).val;
      local_474 = (in_RSI->maximumWidth).val;
      QFixed::QFixed(&local_478,0);
      (in_RSI->maximumWidth).val = local_478.val;
      local_698 = (QTextLayoutStruct *)0x0;
      QTextFrame::iterator::currentBlock((iterator *)in_stack_fffffffffffff838);
      bVar5 = QTextBlock::isValid((QTextBlock *)in_stack_fffffffffffff830);
      if (bVar5) {
        local_698 = (QTextLayoutStruct *)local_68;
      }
      in_stack_fffffffffffff828.val = in_ECX;
      in_stack_fffffffffffff830 = local_698;
      layoutBlock((QTextDocumentLayoutPrivate *)in_stack_fffffffffffff9b8.i,
                  (QTextBlock *)CONCAT44(in_stack_fffffffffffff9b4.val,in_stack_fffffffffffff9b0),
                  blockPosition,(QTextBlockFormat *)CONCAT44(iVar6,in_stack_fffffffffffff9a0.val),
                  in_stack_fffffffffffff998,in_stack_fffffffffffff994.val,
                  in_stack_fffffffffffffdd0.val,
                  (QTextBlockFormat *)
                  CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8.val));
      in_stack_fffffffffffff88f = false;
      if (bVar4) {
        pQVar17 = QTextBlock::layout((QTextBlock *)in_stack_fffffffffffff838);
        QTextLayout::textOption(pQVar17);
        local_480.super_QFlagsStorage<Qt::AlignmentFlag>.i =
             (QFlagsStorage<Qt::AlignmentFlag>)
             QTextOption::alignment((QTextOption *)in_stack_fffffffffffff830);
        local_47c.super_QFlagsStorage<Qt::AlignmentFlag>.i =
             (QFlagsStorage<Qt::AlignmentFlag>)
             QFlags<Qt::AlignmentFlag>::operator&
                       ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffff830,
                        in_stack_fffffffffffff82c.val);
        in_stack_fffffffffffff88f =
             QFlags<Qt::AlignmentFlag>::operator!((QFlags<Qt::AlignmentFlag> *)&local_47c);
      }
      if ((bool)in_stack_fffffffffffff88f != false) {
        *(undefined1 *)(in_RDI + 0x118) = 1;
      }
      bVar5 = isEmptyBlockBeforeTable
                        ((QTextBlock *)in_stack_fffffffffffff840,
                         (QTextBlockFormat *)in_stack_fffffffffffff838,
                         (Iterator *)in_stack_fffffffffffff830);
      if (bVar5) {
        local_118 = &DAT_aaaaaaaaaaaaaaaa;
        local_110 = &DAT_aaaaaaaaaaaaaaaa;
        QTextFrame::iterator::currentBlock((iterator *)in_stack_fffffffffffff838);
        bVar5 = QTextBlock::isValid((QTextBlock *)in_stack_fffffffffffff830);
        if (bVar5) {
          QTextBlock::blockFormat((QTextBlock *)in_stack_fffffffffffff840);
          in_stack_fffffffffffff878 =
               (QTextDocumentLayoutPrivate *)
               QTextBlockFormat::bottomMargin((QTextBlockFormat *)0x804858);
          in_stack_fffffffffffff880 = in_stack_fffffffffffff878;
          QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x804890);
        }
        else {
          in_stack_fffffffffffff878 = (QTextDocumentLayoutPrivate *)0x0;
          in_stack_fffffffffffff880 = in_stack_fffffffffffff878;
        }
        local_488 = in_stack_fffffffffffff878;
        QTextBlock::blockFormat((QTextBlock *)in_stack_fffffffffffff840);
        local_498 = QTextBlockFormat::topMargin((QTextBlockFormat *)0x8048c1);
        qMax<double>((double *)&local_488,&local_498);
        QFixed::fromReal((qreal)CONCAT44(in_stack_fffffffffffff82c.val,in_stack_fffffffffffff828.val
                                        ));
        local_48c = (int)QFixed::operator+((QFixed *)
                                           CONCAT44(in_stack_fffffffffffff82c.val,
                                                    in_stack_fffffffffffff828.val),
                                           (QFixed)(int)in_stack_fffffffffffff830);
        (in_RSI->y).val = local_48c;
        QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x804929);
        (in_RSI->pageBottom).val = local_470.val;
      }
      else {
        QTextFrame::iterator::currentFrame((iterator *)local_d8);
        bVar5 = isEmptyBlockAfterTable
                          ((QTextBlock *)in_stack_fffffffffffff830,
                           (QTextFrame *)
                           CONCAT44(in_stack_fffffffffffff82c.val,in_stack_fffffffffffff828.val));
        if (bVar5) {
          QTextFrame::iterator::currentFrame((iterator *)local_d8);
          pQVar21 = ::data((QTextFrame *)in_stack_fffffffffffff830);
          pQVar17 = QTextBlock::layout((QTextBlock *)in_stack_fffffffffffff838);
          local_4a8.xp = -NAN;
          local_4a8.yp = -NAN;
          local_4b0 = (pQVar21->size).width.val;
          local_4ac = QFixed::operator+((QFixed *)
                                        CONCAT44(in_stack_fffffffffffff82c.val,
                                                 in_stack_fffffffffffff828.val),
                                        (int)in_stack_fffffffffffff830);
          in_stack_fffffffffffff870 = (QTextLayoutStruct *)QFixed::toReal(&local_4ac);
          local_4b8 = (pQVar21->size).height.val;
          local_4b4 = QFixed::operator+((QFixed *)
                                        CONCAT44(in_stack_fffffffffffff82c.val,
                                                 in_stack_fffffffffffff828.val),
                                        (int)in_stack_fffffffffffff830);
          in_stack_fffffffffffff868.i = (QCheckPoint *)QFixed::toReal(&local_4b4);
          QTextLayout::boundingRect
                    ((QTextLayout *)CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888));
          qVar23 = QRectF::height(&local_4d8);
          QPointF::QPointF(&local_4a8,(qreal)in_stack_fffffffffffff870,
                           (double)in_stack_fffffffffffff868.i - qVar23);
          QTextLayout::setPosition(pQVar17,&local_4a8);
          (in_RSI->y).val = local_46c;
          (in_RSI->pageBottom).val = local_470.val;
        }
        QTextFrame::iterator::currentFrame((iterator *)local_d8);
        bVar5 = isLineSeparatorBlockAfterTable
                          ((QTextBlock *)in_stack_fffffffffffff840,
                           (QTextFrame *)in_stack_fffffffffffff838);
        if (bVar5) {
          QTextFrame::iterator::currentFrame((iterator *)local_d8);
          in_stack_fffffffffffff948 = ::data((QTextFrame *)in_stack_fffffffffffff830);
          this_01 = (QTextLayoutStruct *)QTextBlock::layout((QTextBlock *)in_stack_fffffffffffff838)
          ;
          local_4dc.val = -0x55555556;
          iVar9 = QTextLayout::lineCount((QTextLayout *)0x804b2f);
          if (iVar9 < 1) {
            QFixed::QFixed(&local_4dc);
          }
          else {
            QVar24 = QTextLayout::lineAt((QTextLayout *)
                                         CONCAT17(in_stack_fffffffffffff84f,
                                                  CONCAT16(in_stack_fffffffffffff84e,
                                                           in_stack_fffffffffffff848)),
                                         (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
            local_4e8 = QVar24.eng;
            local_4f0 = QVar24.index;
            QTextLine::height((QTextLine *)in_stack_fffffffffffff830);
            local_4dc = QFixed::fromReal((qreal)CONCAT44(in_stack_fffffffffffff82c.val,
                                                         in_stack_fffffffffffff828.val));
          }
          local_4f4 = (in_RSI->pageBottom).val;
          local_4f8 = local_470.val;
          bVar5 = ::operator==((QFixed)local_4f4,local_470);
          if (bVar5) {
            local_4fc = local_4dc.val;
            QFixed::operator-=(&in_RSI->y,local_4dc);
            local_520 = QTextLayout::position((QTextLayout *)in_stack_fffffffffffff838);
            qVar23 = QFixed::toReal(&local_4dc);
            QPointF::QPointF(&local_530,0.0,qVar23);
            local_510 = ::operator-((QPointF *)in_stack_fffffffffffff838,
                                    (QPointF *)in_stack_fffffffffffff830);
            QTextLayout::setPosition((QTextLayout *)this_01,&local_510);
            in_stack_fffffffffffff860.i = (QCheckPoint *)this_01;
          }
          else {
            local_538 = local_4dc.val;
            local_534 = (int)QFixed::operator-((QFixed *)
                                               CONCAT44(in_stack_fffffffffffff82c.val,
                                                        in_stack_fffffffffffff828.val),
                                               (QFixed)(int)in_stack_fffffffffffff830);
            (in_RSI->y).val = local_534;
            (in_RSI->pageBottom).val = local_470.val;
            in_stack_fffffffffffff828.val = in_ECX;
            layoutBlock((QTextDocumentLayoutPrivate *)in_stack_fffffffffffff9b8.i,
                        (QTextBlock *)
                        CONCAT44(in_stack_fffffffffffff9b4.val,in_stack_fffffffffffff9b0),
                        blockPosition,
                        (QTextBlockFormat *)CONCAT44(iVar6,in_stack_fffffffffffff9a0.val),
                        in_stack_fffffffffffff998,in_stack_fffffffffffff994.val,
                        in_stack_fffffffffffffdd0.val,
                        (QTextBlockFormat *)
                        CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8.val));
            in_stack_fffffffffffff830 = local_698;
          }
          iVar6 = QTextLayout::lineCount((QTextLayout *)0x804d0d);
          if (0 < iVar6) {
            local_548.xp = -NAN;
            local_548.yp = -NAN;
            local_550 = (in_stack_fffffffffffff948->size).width.val;
            local_54c = QFixed::operator+((QFixed *)
                                          CONCAT44(in_stack_fffffffffffff82c.val,
                                                   in_stack_fffffffffffff828.val),
                                          (int)in_stack_fffffffffffff830);
            in_stack_fffffffffffff858 = (QList<QCheckPoint> *)QFixed::toReal(&local_54c);
            local_55c = (in_stack_fffffffffffff948->size).height.val;
            local_558 = (int)QFixed::operator+((QFixed *)
                                               CONCAT44(in_stack_fffffffffffff82c.val,
                                                        in_stack_fffffffffffff828.val),
                                               (QFixed)(int)in_stack_fffffffffffff830);
            local_560 = local_4dc.val;
            local_554 = QFixed::operator-((QFixed *)
                                          CONCAT44(in_stack_fffffffffffff82c.val,
                                                   in_stack_fffffffffffff828.val),
                                          (int)in_stack_fffffffffffff830);
            qVar23 = QFixed::toReal(&local_554);
            QPointF::QPointF(&local_548,(qreal)in_stack_fffffffffffff858,qVar23);
            QVar24 = QTextLayout::lineAt((QTextLayout *)
                                         CONCAT17(in_stack_fffffffffffff84f,
                                                  CONCAT16(in_stack_fffffffffffff84e,
                                                           in_stack_fffffffffffff848)),
                                         (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
            local_568 = QVar24.eng;
            local_570 = QVar24.index;
            local_590 = QTextLayout::position((QTextLayout *)in_stack_fffffffffffff838);
            local_580 = ::operator-((QPointF *)in_stack_fffffffffffff838,
                                    (QPointF *)in_stack_fffffffffffff830);
            QTextLine::setPosition
                      ((QTextLine *)in_stack_fffffffffffff830,
                       (QPointF *)
                       CONCAT44(in_stack_fffffffffffff82c.val,in_stack_fffffffffffff828.val));
          }
        }
        local_598.super_QFlagsStorage<QTextFormat::PageBreakFlag>.i =
             (QFlagsStorage<QTextFormat::PageBreakFlag>)
             QTextBlockFormat::pageBreakPolicy((QTextBlockFormat *)in_stack_fffffffffffff830);
        local_594.super_QFlagsStorage<QTextFormat::PageBreakFlag>.i =
             (QFlagsStorage<QTextFormat::PageBreakFlag>)
             QFlags<QTextFormat::PageBreakFlag>::operator&
                       ((QFlags<QTextFormat::PageBreakFlag> *)in_stack_fffffffffffff830,
                        in_stack_fffffffffffff82c.val);
        IVar7 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_594);
        if (IVar7 != 0) {
          QTextLayoutStruct::newPage(in_stack_fffffffffffff838);
        }
      }
      pQVar18 = qMax<QFixed>((QFixed *)in_stack_fffffffffffff840,(QFixed *)in_stack_fffffffffffff838
                            );
      local_1b4.val = pQVar18->val;
      (in_RSI->maximumWidth).val = local_474;
      QTextBlockFormat::operator=
                ((QTextBlockFormat *)in_stack_fffffffffffff830,
                 (QTextBlockFormat *)
                 CONCAT44(in_stack_fffffffffffff82c.val,in_stack_fffffffffffff828.val));
      QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x804f18);
    }
    else {
      in_stack_fffffffffffff998 =
           (QTextLayoutStruct *)::data((QTextFrame *)in_stack_fffffffffffff830);
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      local_90 = &DAT_aaaaaaaaaaaaaaaa;
      QTextFrame::frameFormat((QTextFrame *)in_stack_fffffffffffff840);
      PVar10 = QTextFrameFormat::position((QTextFrameFormat *)0x8035fa);
      if (PVar10 == InFlow) {
        local_200.super_QFlagsStorage<QTextFormat::PageBreakFlag>.i =
             (QFlagsStorage<QTextFormat::PageBreakFlag>)
             QTextFrameFormat::pageBreakPolicy((QTextFrameFormat *)in_stack_fffffffffffff830);
        local_1fc.super_QFlagsStorage<QTextFormat::PageBreakFlag>.i =
             (QFlagsStorage<QTextFormat::PageBreakFlag>)
             QFlags<QTextFormat::PageBreakFlag>::operator&
                       ((QFlags<QTextFormat::PageBreakFlag> *)in_stack_fffffffffffff830,
                        in_stack_fffffffffffff82c.val);
        IVar7 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1fc);
        if (IVar7 != 0) {
          QTextLayoutStruct::newPage(in_stack_fffffffffffff838);
        }
        local_204.val = -0x55555556;
        QFixed::QFixed(&local_204);
        local_208.val = -0x55555556;
        QFixed::QFixed(&local_208);
        floatMargins(in_stack_fffffffffffff878,in_stack_fffffffffffff89c,in_stack_fffffffffffff870,
                     &(in_stack_fffffffffffff868.i)->y,&(in_stack_fffffffffffff860.i)->y);
        pQVar18 = qMax<QFixed>((QFixed *)in_stack_fffffffffffff840,
                               (QFixed *)in_stack_fffffffffffff838);
        local_204.val = pQVar18->val;
        pQVar18 = qMin<QFixed>((QFixed *)in_stack_fffffffffffff840,
                               (QFixed *)in_stack_fffffffffffff838);
        local_208.val = pQVar18->val;
        in_stack_fffffffffffff994 =
             QFixed::operator-((QFixed *)
                               CONCAT44(in_stack_fffffffffffff82c.val,in_stack_fffffffffffff828.val)
                               ,(int)in_stack_fffffffffffff830);
        bVar5 = ::operator<(in_stack_fffffffffffff994,
                            (QFixed)(((QFixedSize *)&in_stack_fffffffffffff998->frameY)->width).val)
        ;
        if (bVar5) {
          QVar11 = findY((QTextDocumentLayoutPrivate *)in_stack_fffffffffffff868.i,
                         (int)in_stack_fffffffffffff8b8,
                         (QTextLayoutStruct *)in_stack_fffffffffffff860.i,in_stack_fffffffffffff8b4)
          ;
          (in_RSI->y).val = QVar11.val;
          in_stack_fffffffffffffddc = (in_RSI->y).val;
          floatMargins(in_stack_fffffffffffff878,in_stack_fffffffffffff89c,in_stack_fffffffffffff870
                       ,&(in_stack_fffffffffffff868.i)->y,&(in_stack_fffffffffffff860.i)->y);
        }
        local_22c.val = -0x55555556;
        in_stack_fffffffffffffdd8.val = -0x55555556;
        local_234 = (in_RSI->y).val;
        in_stack_fffffffffffffdd0.val = local_204.val;
        QFixedPoint::QFixedPoint
                  ((QFixedPoint *)0x803844,in_stack_fffffffffffff82c,in_stack_fffffffffffff828);
        local_238 = 0xaaaaaaaa;
        QFlags<Qt::AlignmentFlag>::QFlags
                  ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffff830,
                   in_stack_fffffffffffff82c.val);
        pQVar19 = qobject_cast<QTextTable*>((QObject *)0x803870);
        if (pQVar19 != (QTextTable *)0x0) {
          QTextTable::format((QTextTable *)in_stack_fffffffffffff840);
          local_240.super_QFlagsStorage<Qt::AlignmentFlag>.i =
               (QFlagsStorage<Qt::AlignmentFlag>)
               QTextTableFormat::alignment((QTextTableFormat *)in_stack_fffffffffffff830);
          local_23c.super_QFlagsStorage<Qt::AlignmentFlag>.i =
               (QFlagsStorage<Qt::AlignmentFlag>)
               QFlags<Qt::AlignmentFlag>::operator&
                         ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffff830,
                          in_stack_fffffffffffff82c.val);
          local_238 = (Int)local_23c.super_QFlagsStorage<Qt::AlignmentFlag>.i;
          QTextTableFormat::~QTextTableFormat((QTextTableFormat *)0x8038e0);
        }
        in_stack_fffffffffffff8ec = in_stack_fffffffffffff8ec & 0xffffff;
        if (bVar4) {
          local_244.super_QFlagsStorage<Qt::AlignmentFlag>.i =
               (QFlagsStorage<Qt::AlignmentFlag>)
               QFlags<Qt::AlignmentFlag>::operator&
                         ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffff830,
                          in_stack_fffffffffffff82c.val);
          bVar5 = QFlags<Qt::AlignmentFlag>::operator!((QFlags<Qt::AlignmentFlag> *)&local_244);
          in_stack_fffffffffffff8ec = CONCAT13(bVar5,(int3)in_stack_fffffffffffff8ec);
        }
        if ((char)(in_stack_fffffffffffff8ec >> 0x18) != '\0') {
          *(undefined1 *)(in_RDI + 0x118) = 1;
        }
        QVar1.y.val = in_stack_fffffffffffffdd8.val;
        QVar1.x.val = local_22c.val;
        *(QFixedPoint *)&in_stack_fffffffffffff998->x_left = QVar1;
        local_258 = QTextDocument::pageSize((QTextDocument *)in_stack_fffffffffffff838);
        qVar23 = QSizeF::height(&local_258);
        if (0.0 < qVar23) {
          *(bool *)&(in_stack_fffffffffffff998->updateRect).yp = true;
        }
        if (((ulong)(in_stack_fffffffffffff998->updateRect).yp & 1) != 0) {
          local_25c.val = local_14c;
          QFixed::QFixed(&local_260,0);
          bVar5 = ::operator!=(local_25c,local_260);
          if (bVar5) {
            local_264 = local_14c;
            in_stack_fffffffffffff8e8 = in_ECX;
            QFixed::QFixed(&local_268,-1);
            local_26c = (in_RSI->frameY).val;
            in_stack_fffffffffffff830 =
                 (QTextLayoutStruct *)
                 CONCAT44((int)((ulong)in_stack_fffffffffffff830 >> 0x20),local_26c);
            in_stack_fffffffffffff828.val = local_268.val;
            layoutFrame(this_00,(QTextFrame *)
                                CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908),
                        (int)((ulong)in_stack_fffffffffffff900 >> 0x20),
                        (int)in_stack_fffffffffffff900,
                        (QFixed)(int)((ulong)in_stack_fffffffffffffc48 >> 0x20),
                        (QFixed)SUB84(in_stack_fffffffffffffc48,0),
                        (QFixed)(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
          }
          else {
            local_294 = (in_RSI->frameY).val;
            layoutFrame(in_stack_fffffffffffff890,
                        (QTextFrame *)CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888),
                        (int)((ulong)in_stack_fffffffffffff880 >> 0x20),
                        (int)in_stack_fffffffffffff880,
                        (QFixed)(int)((ulong)in_stack_fffffffffffff948 >> 0x20));
          }
          local_2bc[0].val = -0x55555556;
          if (pQVar19 == (QTextTable *)0x0) {
            firstChildPos((QTextFrame *)in_stack_fffffffffffff830);
            local_2bc[0] = QFixed::operator+((QFixed *)
                                             CONCAT44(in_stack_fffffffffffff82c.val,
                                                      in_stack_fffffffffffff828.val),
                                             (int)in_stack_fffffffffffff830);
          }
          else {
            ::data((QTextFrame *)in_stack_fffffffffffff830);
            pQVar16 = QList<QFixed>::at((QList<QFixed> *)in_stack_fffffffffffff830,
                                        CONCAT44(in_stack_fffffffffffff82c.val,
                                                 in_stack_fffffffffffff828.val));
            local_2c0 = pQVar16->val;
            local_2bc[0] = QFixed::operator+((QFixed *)
                                             CONCAT44(in_stack_fffffffffffff82c.val,
                                                      in_stack_fffffffffffff828.val),
                                             (int)in_stack_fffffffffffff830);
          }
          local_2c4 = (in_RSI->frameY).val;
          QFixed::operator+=(local_2bc,(QFixed)local_2c4);
          local_2c8 = local_2bc[0].val;
          local_2cc = (in_RSI->pageBottom).val;
          bVar5 = operator>(local_2bc[0],(QFixed)local_2cc);
          if (bVar5) {
            QTextLayoutStruct::newPage(in_stack_fffffffffffff838);
            in_stack_fffffffffffffdd8.val = (in_RSI->y).val;
            QVar2.y.val = in_stack_fffffffffffffdd8.val;
            QVar2.x.val = local_22c.val;
            *(QFixedPoint *)&in_stack_fffffffffffff998->x_left = QVar2;
            *(bool *)&(in_stack_fffffffffffff998->updateRect).yp = true;
            local_2d0.val = local_14c;
            QFixed::QFixed(&local_2d4,0);
            bVar5 = ::operator!=(local_2d0,local_2d4);
            if (bVar5) {
              local_2d8 = local_14c;
              QFixed::QFixed(&local_2dc,-1);
              local_2e0 = (in_RSI->frameY).val;
              in_stack_fffffffffffff830 =
                   (QTextLayoutStruct *)
                   CONCAT44((int)((ulong)in_stack_fffffffffffff830 >> 0x20),local_2e0);
              in_stack_fffffffffffff828.val = local_2dc.val;
              layoutFrame(this_00,(QTextFrame *)
                                  CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908),
                          (int)((ulong)in_stack_fffffffffffff900 >> 0x20),
                          (int)in_stack_fffffffffffff900,
                          (QFixed)(int)((ulong)in_stack_fffffffffffffc48 >> 0x20),
                          (QFixed)SUB84(in_stack_fffffffffffffc48,0),
                          (QFixed)(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
              in_stack_fffffffffffff8b8 = pQVar13;
            }
            else {
              local_304 = (in_RSI->frameY).val;
              layoutFrame(in_stack_fffffffffffff890,
                          (QTextFrame *)
                          CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888),
                          (int)((ulong)in_stack_fffffffffffff880 >> 0x20),
                          (int)in_stack_fffffffffffff880,
                          (QFixed)(int)((ulong)in_stack_fffffffffffff948 >> 0x20));
            }
          }
        }
        local_32c = local_204.val;
        QVar11 = QFixed::operator-((QFixed *)
                                   CONCAT44(in_stack_fffffffffffff82c.val,
                                            in_stack_fffffffffffff828.val),
                                   (int)in_stack_fffffffffffff830);
        local_330 = (((QFixedSize *)&in_stack_fffffffffffff998->frameY)->width).val;
        bVar5 = operator>(QVar11,(QFixed)local_330);
        if (bVar5) {
          local_334.super_QFlagsStorage<Qt::AlignmentFlag>.i =
               (QFlagsStorage<Qt::AlignmentFlag>)
               QFlags<Qt::AlignmentFlag>::operator&
                         ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffff830,
                          in_stack_fffffffffffff82c.val);
          IVar8 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_334);
          if (IVar8 == 0) {
            local_33c.super_QFlagsStorage<Qt::AlignmentFlag>.i =
                 (QFlagsStorage<Qt::AlignmentFlag>)
                 QFlags<Qt::AlignmentFlag>::operator&
                           ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffff830,
                            in_stack_fffffffffffff82c.val);
            IVar8 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_33c);
            if (IVar8 != 0) {
              local_344 = (((QFixedSize *)&in_stack_fffffffffffff998->frameY)->width).val;
              local_340 = (int)QFixed::operator-((QFixed *)
                                                 CONCAT44(in_stack_fffffffffffff82c.val,
                                                          in_stack_fffffffffffff828.val),
                                                 (QFixed)(int)in_stack_fffffffffffff830);
              QVar11 = QFixed::operator/((QFixed *)
                                         CONCAT44(in_stack_fffffffffffff82c.val,
                                                  in_stack_fffffffffffff828.val),0);
              QFixed::operator+=(&local_22c,QVar11);
            }
          }
          else {
            local_338 = (((QFixedSize *)&in_stack_fffffffffffff998->frameY)->width).val;
            QVar11 = QFixed::operator-((QFixed *)
                                       CONCAT44(in_stack_fffffffffffff82c.val,
                                                in_stack_fffffffffffff828.val),
                                       (int)in_stack_fffffffffffff830);
            QFixed::operator+=(&local_22c,QVar11);
          }
        }
        QVar3.y.val = in_stack_fffffffffffffdd8.val;
        QVar3.x.val = local_22c.val;
        *(QFixedPoint *)&in_stack_fffffffffffff998->x_left = QVar3;
        local_348 = (in_stack_fffffffffffff998->y).val;
        QFixed::operator+=(&in_RSI->y,(QFixed)local_348);
        QTextLayoutStruct::currentPage(in_stack_fffffffffffff830);
        local_354 = (in_RSI->pageHeight).val;
        local_350 = (int)::operator*(0,in_stack_fffffffffffff82c);
        local_358 = (in_RSI->pageBottomMargin).val;
        local_34c = (int)QFixed::operator-((QFixed *)
                                           CONCAT44(in_stack_fffffffffffff82c.val,
                                                    in_stack_fffffffffffff828.val),
                                           (QFixed)(int)in_stack_fffffffffffff830);
        (in_RSI->pageBottom).val = local_34c;
        *(bool *)((long)&(in_stack_fffffffffffff998->updateRect).yp + 1) = false;
        QTextFrame::frameFormat((QTextFrame *)in_stack_fffffffffffff840);
        local_360.super_QFlagsStorage<QTextFormat::PageBreakFlag>.i =
             (QFlagsStorage<QTextFormat::PageBreakFlag>)
             QTextFrameFormat::pageBreakPolicy((QTextFrameFormat *)in_stack_fffffffffffff830);
        local_35c.super_QFlagsStorage<QTextFormat::PageBreakFlag>.i =
             (QFlagsStorage<QTextFormat::PageBreakFlag>)
             QFlags<QTextFormat::PageBreakFlag>::operator&
                       ((QFlags<QTextFormat::PageBreakFlag> *)in_stack_fffffffffffff830,
                        in_stack_fffffffffffff82c.val);
        in_stack_fffffffffffff8b4.val =
             ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_35c);
        QTextFrameFormat::~QTextFrameFormat((QTextFrameFormat *)0x803fe0);
        if (in_stack_fffffffffffff8b4.val != 0) {
          QTextLayoutStruct::newPage(in_stack_fffffffffffff838);
        }
      }
      else {
        local_380.xp = -NAN;
        local_380.yp = -NAN;
        local_380.w = -NAN;
        local_380.h = -NAN;
        QFixedPoint::toPointF
                  ((QFixedPoint *)
                   CONCAT17(in_stack_fffffffffffff84f,
                            CONCAT16(in_stack_fffffffffffff84e,in_stack_fffffffffffff848)));
        QFixedSize::toSizeF((QFixedSize *)
                            CONCAT17(in_stack_fffffffffffff84f,
                                     CONCAT16(in_stack_fffffffffffff84e,in_stack_fffffffffffff848)))
        ;
        QRectF::QRectF(in_stack_fffffffffffff840,(QPointF *)in_stack_fffffffffffff838,
                       (QSizeF *)in_stack_fffffffffffff830);
        qVar23 = -NAN;
        qVar26 = -NAN;
        QRectF::QRectF((QRectF *)&stack0xfffffffffffffc40);
        if (((ulong)(in_stack_fffffffffffff998->updateRect).yp & 1) != 0) {
          QFixed::QFixed(&local_3e4,0);
          layoutFrame(in_stack_fffffffffffff890,
                      (QTextFrame *)CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888),
                      (int)((ulong)in_stack_fffffffffffff880 >> 0x20),(int)in_stack_fffffffffffff880
                      ,(QFixed)(int)((ulong)in_stack_fffffffffffff948 >> 0x20));
          qVar23 = local_3e0;
          qVar26 = local_3d8;
        }
        positionFloat(in_stack_fffffffffffff878,
                      (QTextFrame *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                      (QTextLine *)in_stack_fffffffffffff870);
        if (((ulong)(in_stack_fffffffffffff998->updateRect).yp & 1) != 0) {
          in_stack_fffffffffffff898 = local_150;
          in_stack_fffffffffffff89c.val = in_ECX;
          QFixed::QFixed(&local_40c,0);
          layoutFrame(pQVar13,(QTextFrame *)
                              CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888),
                      (int)((ulong)in_stack_fffffffffffff880 >> 0x20),(int)in_stack_fffffffffffff880
                      ,(QFixed)(int)((ulong)in_stack_fffffffffffff948 >> 0x20));
          in_stack_fffffffffffff890 = pQVar13;
          qVar23 = local_408;
          qVar26 = local_400;
        }
        local_430 = -NAN;
        local_428 = -NAN;
        local_420 = 0xffffffffffffffff;
        local_418 = 0xffffffffffffffff;
        local_440 = QFixedPoint::toPointF
                              ((QFixedPoint *)
                               CONCAT17(in_stack_fffffffffffff84f,
                                        CONCAT16(in_stack_fffffffffffff84e,in_stack_fffffffffffff848
                                                )));
        local_450 = QFixedSize::toSizeF((QFixedSize *)
                                        CONCAT17(in_stack_fffffffffffff84f,
                                                 CONCAT16(in_stack_fffffffffffff84e,
                                                          in_stack_fffffffffffff848)));
        QRectF::QRectF(in_stack_fffffffffffff840,(QPointF *)in_stack_fffffffffffff838,
                       (QSizeF *)in_stack_fffffffffffff830);
        bVar5 = ::operator==((QRectF *)in_stack_fffffffffffff830,
                             (QRectF *)
                             CONCAT44(in_stack_fffffffffffff82c.val,in_stack_fffffffffffff828.val));
        in_stack_fffffffffffffc40 = local_430;
        in_stack_fffffffffffffc48 = local_428;
        if ((bVar5) &&
           (bVar5 = QRectF::isValid((QRectF *)&stack0xfffffffffffffc40),
           in_stack_fffffffffffffc40 = local_430, in_stack_fffffffffffffc48 = local_428, bVar5)) {
          local_460 = QFixedPoint::toPointF
                                ((QFixedPoint *)
                                 CONCAT17(in_stack_fffffffffffff84f,
                                          CONCAT16(in_stack_fffffffffffff84e,
                                                   in_stack_fffffffffffff848)));
          QRectF::translate((QRectF *)in_stack_fffffffffffff830,
                            (QPointF *)
                            CONCAT44(in_stack_fffffffffffff82c.val,in_stack_fffffffffffff828.val));
          in_stack_fffffffffffffc40 = qVar23;
          in_stack_fffffffffffffc48 = qVar26;
        }
        QTextLayoutStruct::addUpdateRectForFloat
                  (in_stack_fffffffffffff830,
                   (QRectF *)CONCAT44(in_stack_fffffffffffff82c.val,in_stack_fffffffffffff828.val));
        bVar5 = QRectF::isValid(&local_380);
        if (bVar5) {
          QTextLayoutStruct::addUpdateRectForFloat
                    (in_stack_fffffffffffff830,
                     (QRectF *)CONCAT44(in_stack_fffffffffffff82c.val,in_stack_fffffffffffff828.val)
                    );
        }
      }
      pQVar18 = qMax<QFixed>((QFixed *)in_stack_fffffffffffff840,(QFixed *)in_stack_fffffffffffff838
                            );
      (in_RSI->minimumWidth).val = pQVar18->val;
      pQVar18 = qMin<QFixed>((QFixed *)in_stack_fffffffffffff840,(QFixed *)in_stack_fffffffffffff838
                            );
      (in_RSI->maximumWidth).val = pQVar18->val;
      local_38._0_8_ = in_stack_00000008;
      local_38._8_8_ = in_stack_00000010;
      local_28 = in_stack_00000018;
      local_20 = (undefined1 *)CONCAT44(local_20._4_4_,in_stack_00000020);
      QTextFrame::iterator::operator++((iterator *)in_stack_fffffffffffff868.i);
      QTextFrameFormat::~QTextFrameFormat((QTextFrameFormat *)0x804490);
    }
  }
  local_59c.val = (in_RSI->maximumWidth).val;
  QFixed::QFixed(&local_5a0,0x7fffff);
  bVar5 = ::operator==(local_59c,local_5a0);
  if (bVar5) {
    local_5a4.val = local_1b4.val;
    QFixed::QFixed(&local_5a8,0);
    bVar5 = operator>(local_5a4,local_5a8);
    if (!bVar5) goto LAB_00804fa4;
    (in_RSI->maximumWidth).val = local_1b4.val;
  }
  else {
LAB_00804fa4:
    pQVar18 = qMax<QFixed>((QFixed *)in_stack_fffffffffffff840,(QFixed *)in_stack_fffffffffffff838);
    (in_RSI->maximumWidth).val = pQVar18->val;
  }
  pQVar19 = qobject_cast<QTextTable*>((QObject *)0x804fdd);
  if (pQVar19 == (QTextTable *)0x0) {
    local_5c0.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_5c0.d.ptr = (QTextFrame **)&DAT_aaaaaaaaaaaaaaaa;
    local_5c0.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QTextFrame::childFrames((QTextFrame *)in_stack_fffffffffffff838);
    for (local_6c4 = 0; qVar20 = QList<QTextFrame_*>::size(&local_5c0), local_6c4 < qVar20;
        local_6c4 = local_6c4 + 1) {
      QList<QTextFrame_*>::at
                ((QList<QTextFrame_*> *)in_stack_fffffffffffff830,
                 CONCAT44(in_stack_fffffffffffff82c.val,in_stack_fffffffffffff828.val));
      pQVar21 = ::data((QTextFrame *)in_stack_fffffffffffff830);
      bVar25 = 0;
      if ((pQVar21->layoutDirty & 1U) == 0) {
        QList<QTextFrame_*>::at
                  ((QList<QTextFrame_*> *)in_stack_fffffffffffff830,
                   CONCAT44(in_stack_fffffffffffff82c.val,in_stack_fffffffffffff828.val));
        QTextFrame::frameFormat((QTextFrame *)in_stack_fffffffffffff840);
        PVar10 = QTextFrameFormat::position((QTextFrameFormat *)0x8050df);
        bVar25 = PVar10 != InFlow;
        QTextFrameFormat::~QTextFrameFormat((QTextFrameFormat *)0x80510a);
      }
      if ((bVar25 & 1) != 0) {
        in_stack_fffffffffffff840 = (QRectF *)&in_RSI->y;
        local_5c8 = (pQVar21->size).height.val;
        local_5c4 = (int)QFixed::operator+((QFixed *)
                                           CONCAT44(in_stack_fffffffffffff82c.val,
                                                    in_stack_fffffffffffff828.val),
                                           (QFixed)(int)in_stack_fffffffffffff830);
        pQVar18 = qMax<QFixed>((QFixed *)in_stack_fffffffffffff840,
                               (QFixed *)in_stack_fffffffffffff838);
        (in_RSI->y).val = pQVar18->val;
      }
    }
    QList<QTextFrame_*>::~QList((QList<QTextFrame_*> *)0x8051a1);
  }
  if (bVar4) {
    bVar4 = QList<QPointer<QTextFrame>_>::isEmpty((QList<QPointer<QTextFrame>_> *)0x8051c0);
    if (!bVar4) {
      *(undefined1 *)(in_RDI + 0x118) = 1;
    }
    bVar4 = QTextFrame::iterator::atEnd((iterator *)&stack0x00000008);
    if (!bVar4) {
      QVar11 = QTextLayoutStruct::absoluteY(in_stack_fffffffffffff830);
      QFixed::QFixed(&local_5cc,0x7fffff);
      bVar4 = operator>=(QVar11,local_5cc);
      if (!bVar4) {
        pQVar22 = QList<QCheckPoint>::constLast
                            ((QList<QCheckPoint> *)
                             CONCAT44(in_stack_fffffffffffff82c.val,in_stack_fffffffffffff828.val));
        *(int *)(in_RDI + 0xf8) = pQVar22->positionInFrame;
        goto LAB_0080534c;
      }
    }
    *(undefined4 *)(in_RDI + 0xf8) = 0xffffffff;
    QCheckPoint::QCheckPoint((QCheckPoint *)in_stack_fffffffffffff830);
    QTextDocumentPrivate::length((QTextDocumentPrivate *)0x805298);
    QList<QCheckPoint>::append
              ((QList<QCheckPoint> *)in_stack_fffffffffffff830,
               (parameter_type)CONCAT44(in_stack_fffffffffffff82c.val,in_stack_fffffffffffff828.val)
              );
    QList<QCheckPoint>::size((QList<QCheckPoint> *)(in_RDI + 0x120));
    QList<QCheckPoint>::reserve
              (in_stack_fffffffffffff858,
               CONCAT44(in_stack_fffffffffffff89c.val,in_stack_fffffffffffff898));
  }
LAB_0080534c:
  pQVar12->currentLayoutStruct = (QTextLayoutStruct *)0x0;
  QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x805369);
  if (*(qreal *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::layoutFlow(QTextFrame::Iterator it, QTextLayoutStruct *layoutStruct,
                                            int layoutFrom, int layoutTo, QFixed width)
{
    qCDebug(lcLayout) << "layoutFlow from=" << layoutFrom << "to=" << layoutTo;
    QTextFrameData *fd = data(layoutStruct->frame);

    fd->currentLayoutStruct = layoutStruct;

    QTextFrame::Iterator previousIt;

    const bool inRootFrame = (it.parentFrame() == document->rootFrame());
    if (inRootFrame) {
        bool redoCheckPoints = layoutStruct->fullLayout || checkPoints.isEmpty();

        if (!redoCheckPoints) {
            auto checkPoint = std::lower_bound(checkPoints.begin(), checkPoints.end(), layoutFrom);
            if (checkPoint != checkPoints.end()) {
                if (checkPoint != checkPoints.begin())
                    --checkPoint;

                layoutStruct->y = checkPoint->y;
                layoutStruct->frameY = checkPoint->frameY;
                layoutStruct->minimumWidth = checkPoint->minimumWidth;
                layoutStruct->maximumWidth = checkPoint->maximumWidth;
                layoutStruct->contentsWidth = checkPoint->contentsWidth;

                if (layoutStruct->pageHeight > 0) {
                    int page = layoutStruct->currentPage();
                    layoutStruct->pageBottom = (page + 1) * layoutStruct->pageHeight - layoutStruct->pageBottomMargin;
                }

                it = frameIteratorForTextPosition(checkPoint->positionInFrame);
                checkPoints.resize(checkPoint - checkPoints.begin() + 1);

                if (checkPoint != checkPoints.begin()) {
                    previousIt = it;
                    --previousIt;
                }
            } else {
                redoCheckPoints = true;
            }
        }

        if (redoCheckPoints) {
            checkPoints.clear();
            QCheckPoint cp;
            cp.y = layoutStruct->y;
            cp.frameY = layoutStruct->frameY;
            cp.positionInFrame = 0;
            cp.minimumWidth = layoutStruct->minimumWidth;
            cp.maximumWidth = layoutStruct->maximumWidth;
            cp.contentsWidth = layoutStruct->contentsWidth;
            checkPoints.append(cp);
        }
    }

    QTextBlockFormat previousBlockFormat = previousIt.currentBlock().blockFormat();

    QFixed maximumBlockWidth = 0;
    while (!it.atEnd() && layoutStruct->absoluteY() < QFIXED_MAX) {
        QTextFrame *c = it.currentFrame();

        int docPos;
        if (it.currentFrame())
            docPos = it.currentFrame()->firstPosition();
        else
            docPos = it.currentBlock().position();

        if (inRootFrame) {
            if (qAbs(layoutStruct->y - checkPoints.constLast().y) > 2000) {
                QFixed left, right;
                floatMargins(layoutStruct->y, layoutStruct, &left, &right);
                if (left == layoutStruct->x_left && right == layoutStruct->x_right) {
                    QCheckPoint p;
                    p.y = layoutStruct->y;
                    p.frameY = layoutStruct->frameY;
                    p.positionInFrame = docPos;
                    p.minimumWidth = layoutStruct->minimumWidth;
                    p.maximumWidth = layoutStruct->maximumWidth;
                    p.contentsWidth = layoutStruct->contentsWidth;
                    checkPoints.append(p);

                    if (currentLazyLayoutPosition != -1
                        && docPos > currentLazyLayoutPosition + lazyLayoutStepSize)
                        break;

                }
            }
        }

        if (c) {
            // position child frame
            QTextFrameData *cd = data(c);

            QTextFrameFormat fformat = c->frameFormat();

            if (fformat.position() == QTextFrameFormat::InFlow) {
                if (fformat.pageBreakPolicy() & QTextFormat::PageBreak_AlwaysBefore)
                    layoutStruct->newPage();

                QFixed left, right;
                floatMargins(layoutStruct->y, layoutStruct, &left, &right);
                left = qMax(left, layoutStruct->x_left);
                right = qMin(right, layoutStruct->x_right);

                if (right - left < cd->size.width) {
                    layoutStruct->y = findY(layoutStruct->y, layoutStruct, cd->size.width);
                    floatMargins(layoutStruct->y, layoutStruct, &left, &right);
                }

                QFixedPoint pos(left, layoutStruct->y);

                Qt::Alignment align = Qt::AlignLeft;

                QTextTable *table = qobject_cast<QTextTable *>(c);

                if (table)
                    align = table->format().alignment() & Qt::AlignHorizontal_Mask;

                // detect whether we have any alignment in the document that disallows optimizations,
                // such as not laying out the document again in a textedit with wrapping disabled.
                if (inRootFrame && !(align & Qt::AlignLeft))
                    contentHasAlignment = true;

                cd->position = pos;

                if (document->pageSize().height() > 0.0f)
                    cd->sizeDirty = true;

                if (cd->sizeDirty) {
                    if (width != 0)
                        layoutFrame(c, layoutFrom, layoutTo, width, -1, layoutStruct->frameY);
                    else
                        layoutFrame(c, layoutFrom, layoutTo, layoutStruct->frameY);

                    QFixed absoluteChildPos = table ? pos.y + static_cast<QTextTableData *>(data(table))->rowPositions.at(0) : pos.y + firstChildPos(c);
                    absoluteChildPos += layoutStruct->frameY;

                    // drop entire frame to next page if first child of frame is on next page
                    if (absoluteChildPos > layoutStruct->pageBottom) {
                        layoutStruct->newPage();
                        pos.y = layoutStruct->y;

                        cd->position = pos;
                        cd->sizeDirty = true;

                        if (width != 0)
                            layoutFrame(c, layoutFrom, layoutTo, width, -1, layoutStruct->frameY);
                        else
                            layoutFrame(c, layoutFrom, layoutTo, layoutStruct->frameY);
                    }
                }

                // align only if there is space for alignment
                if (right - left > cd->size.width) {
                    if (align & Qt::AlignRight)
                        pos.x += layoutStruct->x_right - cd->size.width;
                    else if (align & Qt::AlignHCenter)
                        pos.x += (layoutStruct->x_right - cd->size.width) / 2;
                }

                cd->position = pos;

                layoutStruct->y += cd->size.height;
                const int page = layoutStruct->currentPage();
                layoutStruct->pageBottom = (page + 1) * layoutStruct->pageHeight - layoutStruct->pageBottomMargin;

                cd->layoutDirty = false;

                if (c->frameFormat().pageBreakPolicy() & QTextFormat::PageBreak_AlwaysAfter)
                    layoutStruct->newPage();
            } else {
                QRectF oldFrameRect(cd->position.toPointF(), cd->size.toSizeF());
                QRectF updateRect;

                if (cd->sizeDirty)
                    updateRect = layoutFrame(c, layoutFrom, layoutTo);

                positionFloat(c);

                // If the size was made dirty when the position was set, layout again
                if (cd->sizeDirty)
                    updateRect = layoutFrame(c, layoutFrom, layoutTo);

                QRectF frameRect(cd->position.toPointF(), cd->size.toSizeF());

                if (frameRect == oldFrameRect && updateRect.isValid())
                    updateRect.translate(cd->position.toPointF());
                else
                    updateRect = frameRect;

                layoutStruct->addUpdateRectForFloat(updateRect);
                if (oldFrameRect.isValid())
                    layoutStruct->addUpdateRectForFloat(oldFrameRect);
            }

            layoutStruct->minimumWidth = qMax(layoutStruct->minimumWidth, cd->minimumWidth);
            layoutStruct->maximumWidth = qMin(layoutStruct->maximumWidth, cd->maximumWidth);

            previousIt = it;
            ++it;
        } else {
            QTextFrame::Iterator lastIt;
            if (!previousIt.atEnd() && previousIt != it)
                lastIt = previousIt;
            previousIt = it;
            QTextBlock block = it.currentBlock();
            ++it;

            const QTextBlockFormat blockFormat = block.blockFormat();

            if (blockFormat.pageBreakPolicy() & QTextFormat::PageBreak_AlwaysBefore)
                layoutStruct->newPage();

            const QFixed origY = layoutStruct->y;
            const QFixed origPageBottom = layoutStruct->pageBottom;
            const QFixed origMaximumWidth = layoutStruct->maximumWidth;
            layoutStruct->maximumWidth = 0;

            const QTextBlockFormat *previousBlockFormatPtr = nullptr;
            if (lastIt.currentBlock().isValid())
                previousBlockFormatPtr = &previousBlockFormat;

            // layout and position child block
            layoutBlock(block, docPos, blockFormat, layoutStruct, layoutFrom, layoutTo, previousBlockFormatPtr);

            // detect whether we have any alignment in the document that disallows optimizations,
            // such as not laying out the document again in a textedit with wrapping disabled.
            if (inRootFrame && !(block.layout()->textOption().alignment() & Qt::AlignLeft))
                contentHasAlignment = true;

            // if the block right before a table is empty 'hide' it by
            // positioning it into the table border
            if (isEmptyBlockBeforeTable(block, blockFormat, it)) {
                const QTextBlock lastBlock = lastIt.currentBlock();
                const qreal lastBlockBottomMargin = lastBlock.isValid() ? lastBlock.blockFormat().bottomMargin() : 0.0f;
                layoutStruct->y = origY + QFixed::fromReal(qMax(lastBlockBottomMargin, block.blockFormat().topMargin()));
                layoutStruct->pageBottom = origPageBottom;
            } else {
                // if the block right after a table is empty then 'hide' it, too
                if (isEmptyBlockAfterTable(block, lastIt.currentFrame())) {
                    QTextTableData *td = static_cast<QTextTableData *>(data(lastIt.currentFrame()));
                    QTextLayout *layout = block.layout();

                    QPointF pos((td->position.x + td->size.width).toReal(),
                                (td->position.y + td->size.height).toReal() - layout->boundingRect().height());

                    layout->setPosition(pos);
                    layoutStruct->y = origY;
                    layoutStruct->pageBottom = origPageBottom;
                }

                // if the block right after a table starts with a line separator, shift it up by one line
                if (isLineSeparatorBlockAfterTable(block, lastIt.currentFrame())) {
                    QTextTableData *td = static_cast<QTextTableData *>(data(lastIt.currentFrame()));
                    QTextLayout *layout = block.layout();

                    QFixed height = layout->lineCount() > 0 ? QFixed::fromReal(layout->lineAt(0).height()) : QFixed();

                    if (layoutStruct->pageBottom == origPageBottom) {
                        layoutStruct->y -= height;
                        layout->setPosition(layout->position() - QPointF(0, height.toReal()));
                    } else {
                        // relayout block to correctly handle page breaks
                        layoutStruct->y = origY - height;
                        layoutStruct->pageBottom = origPageBottom;
                        layoutBlock(block, docPos, blockFormat, layoutStruct, layoutFrom, layoutTo, previousBlockFormatPtr);
                    }

                    if (layout->lineCount() > 0) {
                        QPointF linePos((td->position.x + td->size.width).toReal(),
                                        (td->position.y + td->size.height - height).toReal());

                        layout->lineAt(0).setPosition(linePos - layout->position());
                    }
                }

                if (blockFormat.pageBreakPolicy() & QTextFormat::PageBreak_AlwaysAfter)
                    layoutStruct->newPage();
            }

            maximumBlockWidth = qMax(maximumBlockWidth, layoutStruct->maximumWidth);
            layoutStruct->maximumWidth = origMaximumWidth;
            previousBlockFormat = blockFormat;
        }
    }
    if (layoutStruct->maximumWidth == QFIXED_MAX && maximumBlockWidth > 0)
        layoutStruct->maximumWidth = maximumBlockWidth;
    else
        layoutStruct->maximumWidth = qMax(layoutStruct->maximumWidth, maximumBlockWidth);

    // a float at the bottom of a frame may make it taller, hence the qMax() for layoutStruct->y.
    // we don't need to do it for tables though because floats in tables are per table
    // and not per cell and layoutCell already takes care of doing the same as we do here
    if (!qobject_cast<QTextTable *>(layoutStruct->frame)) {
        QList<QTextFrame *> children = layoutStruct->frame->childFrames();
        for (int i = 0; i < children.size(); ++i) {
            QTextFrameData *fd = data(children.at(i));
            if (!fd->layoutDirty && children.at(i)->frameFormat().position() != QTextFrameFormat::InFlow)
                layoutStruct->y = qMax(layoutStruct->y, fd->position.y + fd->size.height);
        }
    }

    if (inRootFrame) {
        // we assume that any float is aligned in a way that disallows the optimizations that rely
        // on unaligned content.
        if (!fd->floats.isEmpty())
            contentHasAlignment = true;

        if (it.atEnd() || layoutStruct->absoluteY() >= QFIXED_MAX) {
            //qDebug("layout done!");
            currentLazyLayoutPosition = -1;
            QCheckPoint cp;
            cp.y = layoutStruct->y;
            cp.positionInFrame = docPrivate->length();
            cp.minimumWidth = layoutStruct->minimumWidth;
            cp.maximumWidth = layoutStruct->maximumWidth;
            cp.contentsWidth = layoutStruct->contentsWidth;
            checkPoints.append(cp);
            checkPoints.reserve(checkPoints.size());
        } else {
            currentLazyLayoutPosition = checkPoints.constLast().positionInFrame;
            // #######
            //checkPoints.last().positionInFrame = QTextDocumentPrivate::get(q->document())->length();
        }
    }


    fd->currentLayoutStruct = nullptr;
}